

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

int Js::AssertIntegerProperty(DynamicObject *state,PropertyIds propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *message;
  char *error;
  Var pvVar4;
  uint lineNumber;
  char *fileName;
  ulong uVar5;
  double value;
  Var local_38;
  Var propertyValue;
  
  local_38 = (Var)0x0;
  JavascriptOperators::GetProperty
            (&state->super_RecyclableObject,propertyId._value,&local_38,
             (((((state->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,(PropertyValueInfo *)0x0);
  if (local_38 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x183,"(propertyValue)","propertyValue");
    if (!bVar2) goto LAB_00b6a93d;
    *puVar3 = 0;
  }
  uVar5 = (ulong)local_38 & 0xffff000000000000;
  if (((ulong)local_38 & 0x1ffff00000000) != 0x1000000000000 && uVar5 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b6a93d;
    *puVar3 = 0;
  }
  pvVar4 = local_38;
  if (uVar5 == 0x1000000000000) {
    uVar5 = (ulong)local_38 & 0xffff000000000000;
    if (((ulong)local_38 & 0x1ffff00000000) != 0x1000000000000 && uVar5 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00b6a93d;
      *puVar3 = 0;
    }
    if (uVar5 == 0x1000000000000) goto LAB_00b6a92c;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "(Is(aValue))";
    message = "Ensure var is actually a \'TaggedInt\'";
    lineNumber = 0x43;
  }
  else {
    if ((ulong)local_38 >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x18b,"(JavascriptNumber::Is(propertyValue))",
                                  "JavascriptNumber::Is(propertyValue)");
      if (!bVar2) goto LAB_00b6a93d;
      *puVar3 = 0;
    }
    pvVar4 = local_38;
    if (local_38 < (Var)0x4000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_00b6a93d;
      *puVar3 = 0;
    }
    value = (double)((ulong)pvVar4 ^ 0xfffc000000000000);
    pvVar4 = (Var)(ulong)(uint)(int)value;
    if (((double)(int)value == value) && (!NAN((double)(int)value) && !NAN(value))) {
      bVar2 = NumberUtilities::IsSpecial(value,0x8000000000000000);
      if (!bVar2) goto LAB_00b6a92c;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
    ;
    error = "(JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(propertyValue), &ret))";
    message = "JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(propertyValue), &ret)";
    lineNumber = 0x18d;
  }
  bVar2 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar2) {
LAB_00b6a93d:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00b6a92c:
  return (int)pvVar4;
}

Assistant:

static int AssertIntegerProperty(_In_ DynamicObject *state, _In_ PropertyIds propertyId)
    {
        Var propertyValue = nullptr;
        JavascriptOperators::GetProperty(state, propertyId, &propertyValue, state->GetScriptContext());

        AssertOrFailFast(propertyValue);

        if (TaggedInt::Is(propertyValue))
        {
            return TaggedInt::ToInt32(propertyValue);
        }
        else
        {
            AssertOrFailFast(JavascriptNumber::Is(propertyValue));
            int ret;
            AssertOrFailFast(JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(propertyValue), &ret));

            return ret;
        }
    }